

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidSliceStaticNoParams(void)

{
  ulong uVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  NeuralNetwork *pNVar7;
  NeuralNetworkLayer *this;
  SliceStaticLayerParams *this_00;
  ostream *poVar8;
  string *psVar9;
  long lVar10;
  undefined8 *puVar11;
  int iVar12;
  char *pcVar13;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->input_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pMVar3 = CoreML::Specification::Model::_internal_mutable_description(&m);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar3->output_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar11 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar11 = (undefined8 *)*puVar11;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"output",puVar11);
  pFVar5 = CoreML::Specification::FeatureDescription::_internal_mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::_internal_mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,3);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,5);
  CoreML::Specification::ArrayFeatureType::_internal_add_shape(pAVar6,2);
  pNVar7 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
  pNVar7->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar7->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  this_00 = CoreML::Specification::NeuralNetworkLayer::_internal_mutable_slicestatic(this);
  iVar12 = 1;
  CoreML::Specification::SliceStaticLayerParams::_internal_add_endmasks(this_00,true);
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar2 = CoreML::Result::good(&res1);
  if (bVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x157a);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "!((res1).good())";
  }
  else {
    psVar9 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e2f0c);
    if (lVar10 != -1) {
      CoreML::Specification::SliceStaticLayerParams::_internal_add_beginids(this_00,0);
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar2 = CoreML::Result::good(&res2);
      if (bVar2) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1580);
        poVar8 = std::operator<<(poVar8,": error: ");
        pcVar13 = "!((res2).good())";
LAB_0015a95a:
        poVar8 = std::operator<<(poVar8,pcVar13);
        poVar8 = std::operator<<(poVar8," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar8);
        iVar12 = 1;
      }
      else {
        psVar9 = CoreML::Result::message_abi_cxx11_(&res2);
        lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e2f5d);
        if (lVar10 == -1) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1581);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar13 = "res2.message().find(\"End IDs\") != std::string::npos";
          goto LAB_0015a95a;
        }
        CoreML::Specification::SliceStaticLayerParams::_internal_add_endids(this_00,5);
        CoreML::validate<(MLModelType)500>(&res3,&m);
        bVar2 = CoreML::Result::good(&res3);
        if (bVar2) {
          poVar8 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar8 = std::operator<<(poVar8,":");
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1586);
          poVar8 = std::operator<<(poVar8,": error: ");
          pcVar13 = "!((res3).good())";
LAB_0015aa60:
          poVar8 = std::operator<<(poVar8,pcVar13);
          poVar8 = std::operator<<(poVar8," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar8);
          iVar12 = 1;
        }
        else {
          psVar9 = CoreML::Result::message_abi_cxx11_(&res3);
          lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e2faa);
          if (lVar10 == -1) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1587);
            poVar8 = std::operator<<(poVar8,": error: ");
            pcVar13 = "res3.message().find(\"Strides\") != std::string::npos";
            goto LAB_0015aa60;
          }
          CoreML::Specification::SliceStaticLayerParams::_internal_add_strides(this_00,1);
          CoreML::validate<(MLModelType)500>(&res4,&m);
          bVar2 = CoreML::Result::good(&res4);
          if (bVar2) {
            poVar8 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar8 = std::operator<<(poVar8,":");
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x158c);
            poVar8 = std::operator<<(poVar8,": error: ");
            pcVar13 = "!((res4).good())";
LAB_0015ab6a:
            poVar8 = std::operator<<(poVar8,pcVar13);
            poVar8 = std::operator<<(poVar8," was false, expected true.");
            std::endl<char,std::char_traits<char>>(poVar8);
          }
          else {
            psVar9 = CoreML::Result::message_abi_cxx11_(&res4);
            lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e2ff7);
            if (lVar10 == -1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar8 = std::operator<<(poVar8,":");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x158d);
              poVar8 = std::operator<<(poVar8,": error: ");
              pcVar13 = "res4.message().find(\"Begin masks\") != std::string::npos";
              goto LAB_0015ab6a;
            }
            CoreML::Specification::SliceStaticLayerParams::_internal_add_beginmasks(this_00,true);
            (this_00->endmasks_).current_size_ = 0;
            CoreML::validate<(MLModelType)500>(&res5,&m);
            bVar2 = CoreML::Result::good(&res5);
            if (bVar2) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar8 = std::operator<<(poVar8,":");
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1593);
              poVar8 = std::operator<<(poVar8,": error: ");
              pcVar13 = "!((res5).good())";
LAB_0015abf6:
              poVar8 = std::operator<<(poVar8,pcVar13);
              poVar8 = std::operator<<(poVar8," was false, expected true.");
              std::endl<char,std::char_traits<char>>(poVar8);
              iVar12 = 1;
            }
            else {
              psVar9 = CoreML::Result::message_abi_cxx11_(&res5);
              iVar12 = 0;
              lVar10 = std::__cxx11::string::find((char *)psVar9,0x2e304c);
              if (lVar10 == -1) {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar8 = std::operator<<(poVar8,":");
                poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1594);
                poVar8 = std::operator<<(poVar8,": error: ");
                pcVar13 = "res5.message().find(\"End masks\") != std::string::npos";
                goto LAB_0015abf6;
              }
            }
            std::__cxx11::string::~string((string *)&res5.m_message);
          }
          std::__cxx11::string::~string((string *)&res4.m_message);
        }
        std::__cxx11::string::~string((string *)&res3.m_message);
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_0015ac45;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x157b);
    poVar8 = std::operator<<(poVar8,": error: ");
    pcVar13 = "res1.message().find(\"Begin IDs\") != std::string::npos";
  }
  poVar8 = std::operator<<(poVar8,pcVar13);
  poVar8 = std::operator<<(poVar8," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar8);
  iVar12 = 1;
LAB_0015ac45:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar12;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}